

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

PragmaName * pragmaLocate(char *zName)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  PragmaName *pPVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  
  bVar8 = false;
  iVar5 = 0x41;
  iVar9 = 0;
LAB_0014fc41:
  iVar10 = (iVar5 + iVar9) / 2;
  pcVar2 = aPragmaName[iVar10].zName;
  if (zName == (char *)0x0) {
    iVar7 = -(uint)(pcVar2 != (char *)0x0);
  }
  else {
    if (pcVar2 != (char *)0x0) {
      lVar6 = 0;
      do {
        bVar1 = zName[lVar6];
        if (bVar1 == pcVar2[lVar6]) {
          if ((ulong)bVar1 == 0) goto LAB_0014fca6;
        }
        else {
          iVar7 = (uint)""[bVar1] - (uint)""[(byte)pcVar2[lVar6]];
          if (iVar7 != 0) goto LAB_0014fca8;
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    iVar7 = 1;
  }
  goto LAB_0014fca8;
LAB_0014fca6:
  iVar7 = 0;
LAB_0014fca8:
  if (iVar7 == 0) goto LAB_0014fccc;
  iVar3 = iVar10 + 1;
  if (iVar7 < 0) {
    iVar5 = iVar10 + -1;
    iVar3 = iVar9;
  }
  iVar9 = iVar3;
  bVar8 = iVar5 < iVar9;
  if (iVar5 < iVar9) {
LAB_0014fccc:
    pPVar4 = (PragmaName *)0x0;
    if (!bVar8) {
      pPVar4 = aPragmaName + iVar10;
    }
    return pPVar4;
  }
  goto LAB_0014fc41;
}

Assistant:

static const PragmaName *pragmaLocate(const char *zName){
  int upr, lwr, mid = 0, rc;
  lwr = 0;
  upr = ArraySize(aPragmaName)-1;
  while( lwr<=upr ){
    mid = (lwr+upr)/2;
    rc = sqlite3_stricmp(zName, aPragmaName[mid].zName);
    if( rc==0 ) break;
    if( rc<0 ){
      upr = mid - 1;
    }else{
      lwr = mid + 1;
    }
  }
  return lwr>upr ? 0 : &aPragmaName[mid];
}